

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void anon_unknown.dwarf_1f6b34::GlContextImpl::loadExtensions(void)

{
  char cVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar3;
  char *extensionString_1;
  uint i;
  int numExtensions;
  char *extension;
  char *extensionString;
  glGetStringiFuncType glGetStringiFunc;
  int majorVersion;
  glGetStringFuncType glGetStringFunc;
  glGetIntegervFuncType glGetIntegervFunc;
  glGetErrorFuncType glGetErrorFunc;
  value_type *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff38;
  allocator *paVar4;
  char *in_stack_ffffffffffffff40;
  char *__end;
  char *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_a1;
  string local_a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  uint local_74;
  uint local_70 [5];
  undefined1 local_59 [33];
  char *local_38;
  char *local_30;
  GlFunctionPointer local_28;
  undefined4 local_1c;
  GlFunctionPointer local_18;
  GlFunctionPointer local_10;
  GlFunctionPointer local_8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x23a983);
  local_8 = sf::priv::GlContext::getFunction(in_stack_ffffffffffffff40);
  local_10 = sf::priv::GlContext::getFunction(in_stack_ffffffffffffff40);
  local_18 = sf::priv::GlContext::getFunction(in_stack_ffffffffffffff40);
  if (((local_8 != (GlFunctionPointer)0x0) && (local_10 != (GlFunctionPointer)0x0)) &&
     (local_18 != (GlFunctionPointer)0x0)) {
    local_1c = 0;
    (*local_10)(0x821b,&local_1c);
    local_28 = sf::priv::GlContext::getFunction(in_stack_ffffffffffffff40);
    iVar2 = (*local_8)();
    if ((iVar2 == 0x500) || (local_28 == (GlFunctionPointer)0x0)) {
      local_30 = (char *)(*local_18)(0x1f03);
      do {
        __end = local_30;
        local_38 = local_30;
        while( true ) {
          bVar3 = false;
          if (*local_30 != '\0') {
            bVar3 = *local_30 != ' ';
          }
          if (!bVar3) break;
          local_30 = local_30 + 1;
        }
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
        __beg = local_30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  (this_00,__beg,__end,in_stack_ffffffffffffff38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::__cxx11::string::~string((string *)(local_59 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_59);
        cVar1 = *local_30;
        local_30 = local_30 + 1;
      } while (cVar1 != '\0');
    }
    else {
      local_70[0] = 0;
      (*local_10)(0x821d,local_70);
      if (local_70[0] != 0) {
        for (local_74 = 0; local_74 < local_70[0]; local_74 = local_74 + 1) {
          this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*local_28)(0x1f03,(ulong)local_74);
          paVar4 = &local_a1;
          local_80 = this;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,(char *)this,paVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,in_stack_ffffffffffffff28);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
      }
    }
  }
  return;
}

Assistant:

void loadExtensions()
        {
            extensions.clear();

            glGetErrorFuncType glGetErrorFunc = reinterpret_cast<glGetErrorFuncType>(sf::priv::GlContext::getFunction("glGetError"));
            glGetIntegervFuncType glGetIntegervFunc = reinterpret_cast<glGetIntegervFuncType>(sf::priv::GlContext::getFunction("glGetIntegerv"));
            glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(sf::priv::GlContext::getFunction("glGetString"));

            if (!glGetErrorFunc || !glGetIntegervFunc || !glGetStringFunc)
                return;

            // Check whether a >= 3.0 context is available
            int majorVersion = 0;
            glGetIntegervFunc(GL_MAJOR_VERSION, &majorVersion);

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(sf::priv::GlContext::getFunction("glGetStringi"));

            if (glGetErrorFunc() == GL_INVALID_ENUM || !glGetStringiFunc)
            {
                // Try to load the < 3.0 way
                const char* extensionString = reinterpret_cast<const char*>(glGetStringFunc(GL_EXTENSIONS));

                do
                {
                    const char* extension = extensionString;

                    while (*extensionString && (*extensionString != ' '))
                        extensionString++;

                    extensions.push_back(std::string(extension, extensionString));
                }
                while (*extensionString++);
            }
            else
            {
                // Try to load the >= 3.0 way
                int numExtensions = 0;
                glGetIntegervFunc(GL_NUM_EXTENSIONS, &numExtensions);

                if (numExtensions)
                {
                    for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                    {
                        const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                        extensions.push_back(extensionString);
                    }
                }
            }
        }